

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O2

void print_tables(ip_tables_t *ipts)

{
  ip_table_t *piVar1;
  ip_chain_t *ipc;
  char *pcVar2;
  list_head *plVar3;
  int i;
  long lVar4;
  int i_1;
  long lVar5;
  list_head *plVar6;
  
  if (ipts != (ip_tables_t *)0x0) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      if (ipts->tables[lVar4] != (ip_table_t *)0x0) {
        puts("==================================================");
        pcVar2 = map_int_get_k((int)lVar4,m_table);
        printf("Table %s\n",pcVar2);
        piVar1 = ipts->tables[lVar4];
        for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
          ipc = piVar1->chains[lVar5];
          if (ipc != (ip_chain_t *)0x0) {
            print_chain(ipc);
          }
        }
        plVar3 = &piVar1->child_chains;
        plVar6 = plVar3;
        while (plVar6 = plVar6->next, plVar6 != plVar3) {
          print_chain((ip_chain_t *)&plVar6[-3].prev);
        }
      }
    }
    puts("==================================================");
    return;
  }
  return;
}

Assistant:

void print_tables(ip_tables_t *ipts)
{
	if (ipts == NULL) {
		return;
	}

	for (int i = 0; i < TABLE_MAX; i++) {
		if (ipts->tables[i] != NULL) {
			printf("==================================================\n");
			printf("Table %s\n", map_int_get_k(i, m_table));
			print_table(ipts->tables[i]);
		}
	}

	printf("==================================================\n");
}